

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall embree::ISPCGridMesh::~ISPCGridMesh(ISPCGridMesh *this)

{
  long in_RDI;
  size_t i;
  ISPCGeometry *in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x18) != 0) {
    for (in_stack_fffffffffffffff0 = (ISPCGeometry *)0x0;
        in_stack_fffffffffffffff0 < (ISPCGeometry *)(ulong)*(uint *)(in_RDI + 0x30);
        in_stack_fffffffffffffff0 = (ISPCGeometry *)((long)&in_stack_fffffffffffffff0->type + 1)) {
      alignedUSMFree((void *)0x1e1f59);
    }
    alignedUSMFree((void *)0x1e1f7a);
  }
  alignedUSMFree((void *)0x1e1f8b);
  ISPCGeometry::~ISPCGeometry(in_stack_fffffffffffffff0);
  return;
}

Assistant:

ISPCGridMesh::~ISPCGridMesh ()
  {
    if (positions) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(positions[i]);
      alignedUSMFree(positions);
    }

    alignedUSMFree(grids);
  }